

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop_measures.cc
# Opt level: O1

S2PointLoopSpan __thiscall
S2::PruneDegeneracies
          (S2 *this,S2PointLoopSpan loop,
          vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *new_vertices)

{
  S2 *pSVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  iterator __position;
  double *pdVar5;
  VType VVar6;
  ulong uVar7;
  pointer pVVar8;
  double *pdVar9;
  double *ap_2;
  long lVar10;
  vector<Vector3<double>,std::allocator<Vector3<double>>> *this_00;
  long lVar11;
  size_type sVar12;
  ulong uVar13;
  double *pdVar14;
  ulong uVar15;
  iterator __begin1;
  S2PointLoopSpan SVar16;
  
  this_00 = (vector<Vector3<double>,std::allocator<Vector3<double>>> *)loop.super_S2PointSpan.len_;
  pVVar8 = loop.super_S2PointSpan.ptr_;
  if (*(long *)(this_00 + 8) != *(long *)this_00) {
    *(long *)(this_00 + 8) = *(long *)this_00;
  }
  std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::reserve
            ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)this_00,(size_type)pVVar8
            );
  if (pVVar8 != (pointer)0x0) {
    pSVar1 = this + (long)pVVar8 * 0x18;
    do {
      __position._M_current = *(Vector3<double> **)(this_00 + 8);
      if (*(Vector3<double> **)this_00 != __position._M_current) {
        if ((*(double *)this == __position._M_current[-1].c_[0]) &&
           (!NAN(*(double *)this) && !NAN(__position._M_current[-1].c_[0]))) {
          lVar10 = -0x10;
          do {
            if (lVar10 == 0) goto LAB_00203068;
            lVar11 = lVar10 + 0x18;
            pdVar5 = (double *)((long)(__position._M_current)->c_ + lVar10);
            lVar10 = lVar10 + 8;
          } while ((*(double *)(this + lVar11) == *pdVar5) &&
                  (!NAN(*(double *)(this + lVar11)) && !NAN(*pdVar5)));
        }
      }
      if (1 < (ulong)(((long)__position._M_current - (long)*(Vector3<double> **)this_00 >> 3) *
                     -0x5555555555555555)) {
        if ((*(double *)this == __position._M_current[-2].c_[0]) &&
           (!NAN(*(double *)this) && !NAN(__position._M_current[-2].c_[0]))) {
          lVar10 = 0;
          do {
            if (lVar10 == 0x10) {
              *(Vector3<double> **)(this_00 + 8) = __position._M_current + -1;
              goto LAB_00203068;
            }
            lVar11 = lVar10 + 8;
            pdVar5 = (double *)((long)(__position._M_current)->c_ + lVar10 + -0x28);
            lVar10 = lVar10 + 8;
          } while ((*(double *)(this + lVar11) == *pdVar5) &&
                  (!NAN(*(double *)(this + lVar11)) && !NAN(*pdVar5)));
        }
      }
      if (__position._M_current == *(Vector3<double> **)(this_00 + 0x10)) {
        std::vector<Vector3<double>,std::allocator<Vector3<double>>>::
        _M_realloc_insert<Vector3<double>const&>(this_00,__position,(Vector3<double> *)this);
      }
      else {
        (__position._M_current)->c_[2] = *(VType *)(this + 0x10);
        VVar6 = *(VType *)(this + 8);
        (__position._M_current)->c_[0] = *(VType *)this;
        (__position._M_current)->c_[1] = VVar6;
        *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x18;
      }
LAB_00203068:
      this = this + 0x18;
    } while (this != pSVar1);
  }
  pdVar5 = *(double **)this_00;
  lVar10 = *(long *)(this_00 + 8);
  sVar12 = 0;
  pVVar8 = (pointer)0x0;
  if (2 < (ulong)((lVar10 - (long)pdVar5 >> 3) * -0x5555555555555555)) {
    if ((*pdVar5 == *(double *)(lVar10 + -0x18)) &&
       (!NAN(*pdVar5) && !NAN(*(double *)(lVar10 + -0x18)))) {
      lVar11 = 0;
      while (lVar11 != 0x10) {
        dVar4 = *(double *)((long)pdVar5 + lVar11 + 8);
        pdVar14 = (double *)(lVar10 + -0x10 + lVar11);
        lVar11 = lVar11 + 8;
        if ((dVar4 != *pdVar14) || (NAN(dVar4) || NAN(*pdVar14))) goto LAB_002030d8;
      }
      *(long *)(this_00 + 8) = lVar10 + -0x18;
    }
LAB_002030d8:
    lVar10 = *(long *)(this_00 + 8);
    if ((pdVar5[3] != *(double *)(lVar10 + -0x18)) ||
       (NAN(pdVar5[3]) || NAN(*(double *)(lVar10 + -0x18)))) {
      uVar13 = 0;
    }
    else {
      pdVar14 = (double *)(lVar10 + -0x18);
      pdVar9 = pdVar5 + 4;
      uVar13 = 0;
      uVar7 = 1;
      do {
        uVar15 = uVar7;
        lVar11 = 0;
        while (lVar11 != 0x10) {
          pdVar2 = (double *)((long)pdVar9 + lVar11);
          pdVar3 = (double *)((long)pdVar14 + lVar11 + 8);
          lVar11 = lVar11 + 8;
          if ((*pdVar2 != *pdVar3) || (NAN(*pdVar2) || NAN(*pdVar3))) goto LAB_00203152;
        }
        pdVar14 = (double *)(lVar10 + (long)(int)~(uint)uVar15 * 0x18);
        pdVar9 = pdVar9 + 3;
        uVar13 = uVar15 & 0xffffffff;
      } while ((pdVar5[(uVar15 + 1) * 3] == *pdVar14) &&
              (uVar7 = uVar15 + 1, !NAN(pdVar5[(uVar15 + 1) * 3]) && !NAN(*pdVar14)));
      uVar13 = uVar15 & 0xffffffff;
    }
LAB_00203152:
    pVVar8 = (pointer)(pdVar5 + uVar13 * 3);
    sVar12 = (lVar10 - (long)pdVar5 >> 3) * -0x5555555555555555 - (ulong)(uint)((int)uVar13 * 2);
  }
  SVar16.super_S2PointSpan.len_ = sVar12;
  SVar16.super_S2PointSpan.ptr_ = pVVar8;
  return (S2PointLoopSpan)SVar16.super_S2PointSpan;
}

Assistant:

S2PointLoopSpan PruneDegeneracies(S2PointLoopSpan loop,
                                  vector<S2Point>* new_vertices) {
  vector<S2Point>& vertices = *new_vertices;
  vertices.clear();
  vertices.reserve(loop.size());
  for (const S2Point& v : loop) {
    // Remove duplicate vertices.
    if (vertices.empty() || v != vertices.back()) {
      // Remove edge pairs of the form ABA.
      if (vertices.size() >= 2 && v == vertices.end()[-2]) {
        vertices.pop_back();
      } else {
        vertices.push_back(v);
      }
    }
  }
  // Check whether the loop was completely degenerate.
  if (vertices.size() < 3) return S2PointLoopSpan();

  // Otherwise some portion of the loop is guaranteed to be non-degenerate.
  // However there may still be some degenerate portions to remove.
  if (vertices[0] == vertices.back()) vertices.pop_back();

  // If the loop begins with BA and ends with A, then there is an edge pair of
  // the form ABA at the end/start of the loop.  Remove all such pairs.  As
  // noted above, this is guaranteed to leave a non-degenerate loop.
  int k = 0;
  while (vertices[k + 1] == vertices.end()[-(k + 1)]) ++k;
  return S2PointLoopSpan(vertices.data() + k, vertices.size() - 2 * k);
}